

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChEnumMapper<chrono::ChSystemSMC::TangentialDisplacementModel>::ChEnumMapper
          (ChEnumMapper<chrono::ChSystemSMC::TangentialDisplacementModel> *this)

{
  vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>_>_>
  *__p;
  __shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_20;
  
  (this->super_ChEnumMapperBase)._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_011598e8;
  (this->enummap).
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->value_ptr = (TangentialDisplacementModel *)0x0;
  (this->enummap).
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  __p = (vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>_>_>
         *)::operator_new(0x18);
  (__p->
  super__Vector_base<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->
  super__Vector_base<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->
  super__Vector_base<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  __shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>,std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>>>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>,std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>>>,void>
            ((__shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>,std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>>>,(__gnu_cxx::_Lock_policy)2>
              *)&local_20,__p);
  std::
  __shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&(this->enummap).
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

ChEnumMapper() : value_ptr(0) {
        enummap = std::shared_ptr<std::vector<ChEnumNamePair<Te> > >(new std::vector<ChEnumNamePair<Te> >);
    }